

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

bool __thiscall QString::startsWith(QString *this,QLatin1StringView s,CaseSensitivity cs)

{
  char16_t *pcVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  QStringView lhs;
  
  pcVar5 = (char *)s.m_size;
  pcVar1 = (this->d).ptr;
  pcVar3 = s.m_data;
  if ((pcVar1 != (char16_t *)0x0) && (lVar2 = (this->d).size, pcVar3 = pcVar5, lVar2 != 0)) {
    if ((long)pcVar5 <= lVar2) {
      lhs.m_size = (qsizetype)pcVar5;
      lhs.m_data = pcVar1;
      iVar4 = QtPrivate::compareStrings(lhs,s,cs);
      return iVar4 == 0;
    }
    return false;
  }
  return pcVar3 == (char *)0x0;
}

Assistant:

bool QString::startsWith(QLatin1StringView s, Qt::CaseSensitivity cs) const
{
    return qt_starts_with_impl(QStringView(*this), s, cs);
}